

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

bool __thiscall duckdb::ART::MergeIndexes(ART *this,IndexLock *state,BoundIndex *other_index)

{
  _Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
  this_00;
  bool bVar1;
  type paVar2;
  idx_t i;
  long lVar3;
  unsafe_vector<idx_t> upper_bounds;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  bVar1 = true;
  if (*(char *)((long)&other_index[1].super_Index._vptr_Index + 7) != '\0') {
    if (*(char *)&other_index[1].super_Index.column_ids.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == '\x01') {
      if (0xffffffffffffff < (this->tree).super_IndexPointer.data) {
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        InitializeMerge(this,(unsafe_vector<idx_t> *)&local_48);
        Node::InitMerge((Node *)(other_index + 1),(ART *)other_index,
                        (unsafe_vector<idx_t> *)&local_48);
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48)
        ;
      }
      lVar3 = 0;
      while( true ) {
        shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
        ::operator->(&this->allocators);
        if (lVar3 == 9) break;
        paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                 ::operator*(&this->allocators);
        this_00.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
             paVar2->_M_elems[lVar3].
             super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
             .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>;
        paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                 ::operator*((shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                              *)&other_index[1].super_Index.column_ids);
        FixedSizeAllocator::Merge
                  ((FixedSizeAllocator *)
                   this_00.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,
                   (FixedSizeAllocator *)
                   paVar2->_M_elems[lVar3].
                   super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
        lVar3 = lVar3 + 1;
      }
    }
    bVar1 = Node::Merge(&this->tree,this,(Node *)(other_index + 1),
                        (GateStatus)((this->tree).super_IndexPointer.data >> 0x3f));
  }
  return bVar1;
}

Assistant:

bool ART::MergeIndexes(IndexLock &state, BoundIndex &other_index) {
	auto &other_art = other_index.Cast<ART>();
	if (!other_art.tree.HasMetadata()) {
		return true;
	}

	if (other_art.owns_data) {
		if (tree.HasMetadata()) {
			// Fully deserialize other_index, and traverse it to increment its buffer IDs.
			unsafe_vector<idx_t> upper_bounds;
			InitializeMerge(upper_bounds);
			other_art.tree.InitMerge(other_art, upper_bounds);
		}

		// Merge the node storage.
		for (idx_t i = 0; i < allocators->size(); i++) {
			(*allocators)[i]->Merge(*(*other_art.allocators)[i]);
		}
	}

	// Merge the ARTs.
	D_ASSERT(tree.GetGateStatus() == other_art.tree.GetGateStatus());
	if (!tree.Merge(*this, other_art.tree, tree.GetGateStatus())) {
		return false;
	}
	return true;
}